

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdGetVectorLength(INSTRUX *Instrux)

{
  uint uVar1;
  int iVar2;
  INSTRUX *Instrux_local;
  
  if ((((*(uint *)&Instrux->field_0x5 >> 0x19 & 1) == 0) &&
      ((*(uint *)&Instrux->field_0x5 >> 0x1a & 1) == 0)) &&
     ((*(uint *)&Instrux->field_0x5 >> 0x1e & 1) == 0)) {
    uVar1 = (uint)Instrux->Exs >> 0xe & 3;
    if (uVar1 == 0) {
      *(uint *)Instrux = *(uint *)Instrux & 0xffffcfff;
      *(uint *)Instrux = *(uint *)Instrux & 0xffff3fff;
    }
    else if (uVar1 == 1) {
      *(uint *)Instrux = *(uint *)Instrux & 0xffffcfff | 0x1000;
      *(uint *)Instrux =
           *(uint *)Instrux & 0xffff3fff | (uint)((Instrux->Attributes & 0x200) == 0) << 0xe;
    }
    else {
      if (uVar1 != 2) {
        return 0x80000041;
      }
      *(uint *)Instrux = *(uint *)Instrux & 0xffffcfff | 0x2000;
      iVar2 = 2;
      if ((Instrux->Attributes & 0x200) != 0) {
        iVar2 = 0;
      }
      *(uint *)Instrux = *(uint *)Instrux & 0xffff3fff | iVar2 << 0xe;
    }
    if (((*(uint *)Instrux >> 0xe & 3) == 0) && ((Instrux->Attributes & 0x8000) != 0)) {
      Instrux_local._4_4_ = 0x80000002;
    }
    else {
      Instrux_local._4_4_ = 0;
    }
  }
  else {
    if (((Instrux->TupleType == '\x06') || (Instrux->TupleType == '\x04')) ||
       ((Instrux->TupleType == '\x05' || (Instrux->TupleType == '\a')))) {
      *(uint *)Instrux = *(uint *)Instrux & 0xffff3fff;
      *(uint *)Instrux = *(uint *)Instrux & 0xffffcfff;
    }
    else if (((byte)((ushort)*(undefined2 *)((long)&Instrux->field_73 + 1) >> 10) & 1) == 0) {
      *(uint *)Instrux = *(uint *)Instrux & 0xffff3fff | 0x4000;
      *(uint *)Instrux = *(uint *)Instrux & 0xffffcfff | 0x1000;
    }
    else {
      *(uint *)Instrux = *(uint *)Instrux & 0xffff3fff | 0x8000;
      *(uint *)Instrux = *(uint *)Instrux & 0xffffcfff | 0x2000;
    }
    Instrux_local._4_4_ = 0;
  }
  return Instrux_local._4_4_;
}

Assistant:

static NDSTATUS
NdGetVectorLength(
    INSTRUX *Instrux
    )
{
    if (Instrux->HasEr || Instrux->HasSae || Instrux->HasIgnEr)
    {
        // Embedded rounding or SAE present, force the vector length to 512 or scalar.
        if ((Instrux->TupleType == ND_TUPLE_T1S) || 
            (Instrux->TupleType == ND_TUPLE_T1S8) ||
            (Instrux->TupleType == ND_TUPLE_T1S16) ||
            (Instrux->TupleType == ND_TUPLE_T1F))
        {
            // Scalar instruction, vector length is 128 bits.
            Instrux->VecMode = Instrux->EfVecMode = ND_VECM_128;
        }
        else if (Instrux->Evex.u == 0)
        {
            // AVX 10 allows SAE/ER for 256-bit vector length, if EVEX.U is 0.
            // It is unclear whether the EVEX.U bit is ignored or reserved for scalar instructions.
            Instrux->VecMode = Instrux->EfVecMode = ND_VECM_256;
        }
        else
        {
            // Legacy or AVX 10 instruction with U bit set, vector length is 512 bits.
            Instrux->VecMode = Instrux->EfVecMode = ND_VECM_512;
        }

        return ND_STATUS_SUCCESS;
    }

    // Decode EVEX vector length. Also take into consideration the "ignore L" flag.
    switch (Instrux->Exs.l)
    {
    case 0:
        Instrux->VecMode = ND_VECM_128;
        Instrux->EfVecMode = ND_VECM_128;
        break;
    case 1:
        Instrux->VecMode = ND_VECM_256;
        Instrux->EfVecMode = (Instrux->Attributes & ND_FLAG_LIG) ? ND_VECM_128 : ND_VECM_256;
        break;
    case 2:
        Instrux->VecMode = ND_VECM_512;
        Instrux->EfVecMode = (Instrux->Attributes & ND_FLAG_LIG) ? ND_VECM_128 : ND_VECM_512;
        break;
    default:
        return ND_STATUS_BAD_EVEX_LL;
    }

    // Some instructions don't support 128 bit vectors.
    if ((ND_VECM_128 == Instrux->EfVecMode) && (0 != (Instrux->Attributes & ND_FLAG_NOL0)))
    {
        return ND_STATUS_INVALID_ENCODING;
    }

    return ND_STATUS_SUCCESS;
}